

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::ChromeProcessDescriptor::Serialize
          (ChromeProcessDescriptor *this,Message *msg)

{
  bool bVar1;
  void *data;
  size_t size;
  Message *msg_local;
  ChromeProcessDescriptor *this_local;
  
  bVar1 = std::bitset<6UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::ChromeProcessDescriptor_ProcessType>
              (msg,1,this->process_type_);
  }
  bVar1 = std::bitset<6UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    protozero::Message::AppendVarInt<int>(msg,2,this->process_priority_);
  }
  bVar1 = std::bitset<6UL>::operator[](&this->_has_field_,3);
  if (bVar1) {
    protozero::Message::AppendVarInt<int>(msg,3,this->legacy_sort_index_);
  }
  bVar1 = std::bitset<6UL>::operator[](&this->_has_field_,4);
  if (bVar1) {
    protozero::Message::AppendString(msg,4,&this->host_app_package_name_);
  }
  bVar1 = std::bitset<6UL>::operator[](&this->_has_field_,5);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,5,this->crash_trace_id_);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void ChromeProcessDescriptor::Serialize(::protozero::Message* msg) const {
  // Field 1: process_type
  if (_has_field_[1]) {
    msg->AppendVarInt(1, process_type_);
  }

  // Field 2: process_priority
  if (_has_field_[2]) {
    msg->AppendVarInt(2, process_priority_);
  }

  // Field 3: legacy_sort_index
  if (_has_field_[3]) {
    msg->AppendVarInt(3, legacy_sort_index_);
  }

  // Field 4: host_app_package_name
  if (_has_field_[4]) {
    msg->AppendString(4, host_app_package_name_);
  }

  // Field 5: crash_trace_id
  if (_has_field_[5]) {
    msg->AppendVarInt(5, crash_trace_id_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}